

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O0

void secp256k1_testrand_flip(uchar *b,size_t len)

{
  uint32_t range;
  uint32_t uVar1;
  uint64_t uVar2;
  long in_RDI;
  int in_stack_ffffffffffffffdc;
  
  uVar2 = secp256k1_testrand_bits(in_stack_ffffffffffffffdc);
  range = 1 << ((byte)uVar2 & 0x1f);
  uVar1 = secp256k1_testrand_int(range);
  *(byte *)(in_RDI + (ulong)uVar1) = *(byte *)(in_RDI + (ulong)uVar1) ^ (byte)range;
  return;
}

Assistant:

static void secp256k1_testrand_flip(unsigned char *b, size_t len) {
    b[secp256k1_testrand_int(len)] ^= (1 << secp256k1_testrand_bits(3));
}